

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O2

void __thiscall
QueryDatabaseSearcherWorker<DNA>::Process
          (QueryDatabaseSearcherWorker<DNA> *this,SequenceList<DNA> *queries)

{
  _Elt_pointer pSVar1;
  _Elt_pointer pSVar2;
  _Elt_pointer query;
  pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_> local_190;
  undefined1 local_e0 [8];
  HitList<DNA> hits;
  QueryWithHitsList<DNA> list;
  _Map_pointer local_38;
  
  std::
  _Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::_Deque_base((_Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
                 *)&hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node);
  query = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
          super__Deque_impl_data._M_start._M_cur;
  pSVar2 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_38 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pSVar1 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (query != pSVar1) {
    Search<DNA>::Query((HitList<DNA> *)local_e0,(Search<DNA> *)this,query);
    if (hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node !=
        (_Map_pointer)
        hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.super__Deque_impl_data.
        _M_map_size) {
      std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>::
      pair<std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_&,_true>
                (&local_190,query,(HitList<DNA> *)local_e0);
      std::
      deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>
      ::emplace_back<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>
                ((deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>
                  *)&hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node,&local_190);
      std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>::~pair(&local_190)
      ;
    }
    std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::~deque((HitList<DNA> *)local_e0);
    query = query + 1;
    if (query == pSVar2) {
      query = local_38[1];
      local_38 = local_38 + 1;
      pSVar2 = query + 5;
    }
  }
  if (list.
      super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      list.
      super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Enqueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)this->mWriter,
              (deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
               *)&hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
  }
  std::
  deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::~deque((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
            *)&hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void Process( const SequenceList< A >& queries ) {
    QueryWithHitsList< A > list;

    for( auto& query : queries ) {
      auto hits = mGlobalSearch.Query( query );
      if( hits.empty() )
        continue;

      list.push_back( { query, hits } );
    }

    if( !list.empty() ) {
      mWriter.Enqueue( list );
    }
  }